

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

void Dam_ManCreateMultiRefs(Dam_Man_t *p,Vec_Int_t **pvRefsAnd,Vec_Int_t **pvRefsXor)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Vec_Int_t *pVVar5;
  bool bVar6;
  Vec_Int_t *pVVar7;
  int *__s;
  Vec_Int_t *pVVar8;
  int *__s_00;
  int iVar9;
  int iVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  
  pGVar2 = p->pGia;
  iVar1 = pGVar2->nObjs;
  iVar10 = iVar1 * 2;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar9 = iVar10;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar9;
  if (iVar9 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar9 << 2);
  }
  pVVar7->pArray = __s;
  pVVar7->nSize = iVar10;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar1 << 3);
  }
  iVar1 = pGVar2->nObjs;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar10 = iVar1;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar10;
  if (iVar10 == 0) {
    __s_00 = (int *)0x0;
  }
  else {
    __s_00 = (int *)malloc((long)iVar10 << 2);
  }
  pVVar8->pArray = __s_00;
  pVVar8->nSize = iVar1;
  if (__s_00 != (int *)0x0) {
    memset(__s_00,0,(long)iVar1 << 2);
  }
  uVar14 = (ulong)(uint)pGVar2->nObjs;
  if ((0 < pGVar2->nObjs) && (pGVar3 = pGVar2->pObjs, pGVar3 != (Gia_Obj_t *)0x0)) {
    lVar11 = 0;
    do {
      uVar4 = *(ulong *)(pGVar3 + lVar11);
      uVar15 = (uint)uVar4;
      if ((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar15) {
        pVVar5 = p->vNod2Set;
        if ((lVar11 < pVVar5->nSize) && (pVVar5->pArray[lVar11] != 0)) {
          uVar16 = 0;
          if (lVar11 < pVVar5->nSize) {
            uVar16 = pVVar5->pArray[lVar11];
          }
          if (uVar16 == 0) {
            piVar12 = (int *)0x0;
          }
          else {
            if (((int)uVar16 < 0) || (p->vSetStore->nSize <= (int)uVar16)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
            }
            piVar12 = p->vSetStore->pArray + uVar16;
          }
          bVar6 = (int)(uVar4 & 0x1fffffff) == 0x1fffffff || (int)uVar15 < 0;
          if (bVar6) goto LAB_006fafe9;
          uVar16 = (uint)(uVar4 >> 0x20);
          if ((uVar15 & 0x1fffffff) < (uVar16 & 0x1fffffff)) {
            if (0 < *piVar12) {
              lVar13 = 0;
              do {
                uVar15 = piVar12[lVar13 + 1];
                if ((int)uVar15 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                ,0x130,"int Abc_LitIsCompl(int)");
                }
                if ((uVar15 & 1) != 0) {
                  __assert_fail("!Abc_LitIsCompl(pSet[k])",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                                ,0x254,
                                "void Dam_ManCreateMultiRefs(Dam_Man_t *, Vec_Int_t **, Vec_Int_t **)"
                               );
                }
                if (pVVar8->nSize <= (int)(uVar15 >> 1)) {
LAB_006faf8c:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
                }
                __s_00[uVar15 >> 1] = __s_00[uVar15 >> 1] + 1;
                lVar13 = lVar13 + 1;
              } while (lVar13 < *piVar12);
            }
          }
          else {
            if ((bVar6) || ((uVar15 & 0x1fffffff) <= (uVar16 & 0x1fffffff))) {
LAB_006fafe9:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                            ,0x25a,
                            "void Dam_ManCreateMultiRefs(Dam_Man_t *, Vec_Int_t **, Vec_Int_t **)");
            }
            if ((int)uVar14 <= lVar11) {
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            if ((pGVar2->pMuxes != (uint *)0x0) && (pGVar2->pMuxes[lVar11] != 0)) goto LAB_006fafe9;
            if (0 < *piVar12) {
              lVar13 = 0;
              do {
                iVar1 = piVar12[lVar13 + 1];
                if (((long)iVar1 < 0) || (pVVar7->nSize <= iVar1)) goto LAB_006faf8c;
                __s[iVar1] = __s[iVar1] + 1;
                lVar13 = lVar13 + 1;
              } while (lVar13 < *piVar12);
            }
          }
        }
      }
      lVar11 = lVar11 + 1;
      uVar14 = (ulong)pGVar2->nObjs;
    } while (lVar11 < (long)uVar14);
  }
  *pvRefsAnd = pVVar7;
  *pvRefsXor = pVVar8;
  return;
}

Assistant:

void Dam_ManCreateMultiRefs( Dam_Man_t * p, Vec_Int_t ** pvRefsAnd, Vec_Int_t ** pvRefsXor )  
{
    Vec_Int_t * vRefsAnd, * vRefsXor;
    Gia_Obj_t * pObj;
    int i, k, * pSet;
    vRefsAnd = Vec_IntStart( 2 * Gia_ManObjNum(p->pGia) );
    vRefsXor = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( !Dam_ObjHand(p, i) )
            continue;
        pSet = Dam_ObjSet(p, i);
        if ( Gia_ObjIsXor(pObj) )
            for ( k = 1; k <= pSet[0]; k++ )
            {
                assert( !Abc_LitIsCompl(pSet[k]) );
                Vec_IntAddToEntry( vRefsXor, Abc_Lit2Var(pSet[k]), 1 );
            }
        else if ( Gia_ObjIsAndReal(p->pGia, pObj) )
            for ( k = 1; k <= pSet[0]; k++ )
                Vec_IntAddToEntry( vRefsAnd, pSet[k], 1 );
        else assert( 0 );
    }
    *pvRefsAnd = vRefsAnd;
    *pvRefsXor = vRefsXor;
}